

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O0

void __thiscall DrawerCommandQueue::DrawerCommandQueue(DrawerCommandQueue *this)

{
  DrawerCommandQueue *this_local;
  
  this->memorypool_pos = 0;
  std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::vector(&this->commands);
  std::vector<DrawerThread,_std::allocator<DrawerThread>_>::vector(&this->threads);
  std::mutex::mutex(&this->start_mutex);
  std::condition_variable::condition_variable(&this->start_condition);
  std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::vector(&this->active_commands);
  this->shutdown_flag = false;
  this->run_id = 0;
  std::mutex::mutex(&this->end_mutex);
  std::condition_variable::condition_variable(&this->end_condition);
  this->finished_threads = 0;
  FString::FString(&this->thread_error);
  this->thread_error_fatal = false;
  this->threaded_render = 0;
  DrawerThread::DrawerThread(&this->single_core_thread);
  this->num_passes = 1;
  this->rows_in_pass = 0xe10;
  return;
}

Assistant:

DrawerCommandQueue::DrawerCommandQueue()
{
}